

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O2

uint32_t __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::DecodeSymbol
          (MeshEdgebreakerTraversalValenceDecoder *this)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = (long)this->active_context_;
  if (lVar6 == -1) {
    uVar4 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                      (&this->super_MeshEdgebreakerTraversalDecoder);
    if (uVar4 < 0x202) {
      uVar5 = MeshEdgebreakerTraversalDecoder::DecodeSymbol
                        (&this->super_MeshEdgebreakerTraversalDecoder);
    }
    else {
      uVar5 = 7;
    }
  }
  else {
    piVar3 = (this->context_counters_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar3[lVar6];
    uVar1 = iVar2 - 1;
    piVar3[lVar6] = uVar1;
    if (iVar2 < 1) {
      return 9;
    }
    uVar7 = (ulong)*(uint *)(*(long *)&(this->context_symbols_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [this->active_context_].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + (ulong)uVar1 * 4);
    if (4 < uVar7) {
      return 9;
    }
    uVar5 = *(uint32_t *)(edge_breaker_symbol_to_topology_id + uVar7 * 4);
  }
  this->last_symbol_ = uVar5;
  return uVar5;
}

Assistant:

inline uint32_t DecodeSymbol() {
    // First check if we have a valid context.
    if (active_context_ != -1) {
      const int context_counter = --context_counters_[active_context_];
      if (context_counter < 0) {
        return TOPOLOGY_INVALID;
      }
      const uint32_t symbol_id =
          context_symbols_[active_context_][context_counter];
      if (symbol_id > 4) {
        return TOPOLOGY_INVALID;
      }
      last_symbol_ = edge_breaker_symbol_to_topology_id[symbol_id];
    } else {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
        // We don't have a predicted symbol or the symbol was mis-predicted.
        // Decode it directly.
        last_symbol_ = MeshEdgebreakerTraversalDecoder::DecodeSymbol();

      } else
#endif
      {
        // The first symbol must be E.
        last_symbol_ = TOPOLOGY_E;
      }
    }
    return last_symbol_;
  }